

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::remap_constexpr_sampler
          (CompilerMSL *this,VariableID id,MSLConstexprSampler *sampler)

{
  SPIRType *__src;
  bool bVar1;
  uint32_t uVar2;
  SPIRVariable *pSVar3;
  CompilerError *pCVar4;
  mapped_type *__dest;
  uint32_t local_38 [4];
  SPIRType *local_28;
  SPIRType *type;
  MSLConstexprSampler *sampler_local;
  CompilerMSL *this_local;
  VariableID id_local;
  
  type = (SPIRType *)sampler;
  sampler_local = (MSLConstexprSampler *)this;
  this_local._4_4_ = id.id;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  pSVar3 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar3->super_IVariant).field_0xc);
  local_28 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  if ((local_28->basetype != SampledImage) && (local_28->basetype != Sampler)) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Can only remap SampledImage and Sampler type.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar1 = VectorView<unsigned_int>::empty(&(local_28->array).super_VectorView<unsigned_int>);
  __src = type;
  if (!bVar1) {
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar4,"Can not remap array of samplers.");
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  local_38[0] = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  __dest = ::std::
           map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
           ::operator[](&this->constexpr_samplers_by_id,local_38);
  memcpy(__dest,__src,100);
  return;
}

Assistant:

void CompilerMSL::remap_constexpr_sampler(VariableID id, const MSLConstexprSampler &sampler)
{
	auto &type = get<SPIRType>(get<SPIRVariable>(id).basetype);
	if (type.basetype != SPIRType::SampledImage && type.basetype != SPIRType::Sampler)
		SPIRV_CROSS_THROW("Can only remap SampledImage and Sampler type.");
	if (!type.array.empty())
		SPIRV_CROSS_THROW("Can not remap array of samplers.");
	constexpr_samplers_by_id[id] = sampler;
}